

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool __thiscall
ON_Extrusion::Split(ON_Extrusion *this,int dir,double c,ON_Surface **west_or_south_side,
                   ON_Surface **east_or_north_side)

{
  double dVar1;
  double t0;
  double t1;
  double x;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  ON_Extrusion *this_00;
  ON_Extrusion *this_01;
  ON_Curve *pOVar5;
  bool bVar6;
  undefined4 uVar7;
  ON_Line right_path;
  ON_Line left_path;
  ON_Interval domain;
  ON_Interval right_t;
  ON_Interval left_t;
  ON_Interval right_domain;
  ON_Interval left_domain;
  ON_3dPoint P;
  
  if (((1 < (uint)dir) || (bVar2 = ON_IsValid(c), !bVar2)) ||
     ((*west_or_south_side != (ON_Surface *)0x0 && (*west_or_south_side == *east_or_north_side)))) {
    return false;
  }
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
  dVar1 = ON_Interval::NormalizedParameterAt(&domain,c);
  if (dVar1 <= 0.0) {
    return false;
  }
  if (1.0 <= dVar1) {
    return false;
  }
  pdVar4 = ON_Interval::operator[](&domain,0);
  if (c <= *pdVar4) {
    return false;
  }
  pdVar4 = ON_Interval::operator[](&domain,1);
  if (*pdVar4 <= c) {
    return false;
  }
  if ((ON_Object *)*west_or_south_side == (ON_Object *)0x0) {
    this_00 = (ON_Extrusion *)0x0;
  }
  else {
    this_00 = Cast((ON_Object *)*west_or_south_side);
    if (this_00 == (ON_Extrusion *)0x0) {
      return false;
    }
  }
  uVar7 = SUB84(c,0);
  if ((ON_Object *)*east_or_north_side == (ON_Object *)0x0) {
    this_01 = (ON_Extrusion *)0x0;
  }
  else {
    this_01 = Cast((ON_Object *)*east_or_north_side);
    if (this_01 == (ON_Extrusion *)0x0) {
      return false;
    }
  }
  if ((this->m_bTransposed ^ 1) == dir) {
    ON_Line::ON_Line(&left_path);
    ON_Line::ON_Line(&right_path);
    ON_Interval::ON_Interval(&left_domain);
    ON_Interval::ON_Interval(&right_domain);
    ON_Interval::ON_Interval(&left_t);
    ON_Interval::ON_Interval(&right_t);
    t0 = ON_Interval::operator[](&this->m_t,0);
    t1 = ON_Interval::operator[](&this->m_t,1);
    x = (1.0 - dVar1) * t0 + dVar1 * t1;
    bVar2 = ON_IsValid(x);
    bVar6 = false;
    if ((x < t1) && (t0 < x && bVar2)) {
      ON_Line::PointAt(&P,&this->m_path,dVar1);
      left_path.from.z = (this->m_path).from.z;
      left_path.from.x = (this->m_path).from.x;
      left_path.from.y = (this->m_path).from.y;
      left_path.to.x = P.x;
      left_path.to.y = P.y;
      left_path.to.z = P.z;
      right_path.from.x = P.x;
      right_path.from.y = P.y;
      right_path.from.z = P.z;
      right_path.to.x = (this->m_path).to.x;
      right_path.to.y = (this->m_path).to.y;
      right_path.to.z = (this->m_path).to.z;
      pdVar4 = ON_Interval::operator[](&domain,0);
      ON_Interval::Set(&left_domain,*pdVar4,c);
      pdVar4 = ON_Interval::operator[](&domain,1);
      ON_Interval::Set(&right_domain,c,*pdVar4);
      ON_Interval::Set(&left_t,t0,x);
      ON_Interval::Set(&right_t,x,t1);
      bVar2 = ON_Line::IsValid(&left_path);
      if ((!bVar2) ||
         (((dVar1 = ON_Line::Length(&left_path), dVar1 <= 2.3283064365386963e-10 ||
           (bVar2 = ON_Line::IsValid(&right_path), !bVar2)) ||
          (dVar1 = ON_Line::Length(&right_path), dVar1 <= 2.3283064365386963e-10)))) {
        bVar6 = false;
      }
      else {
        if (this_00 == (ON_Extrusion *)0x0) {
          this_00 = (ON_Extrusion *)operator_new(0xd0);
          ON_Extrusion(this_00,this);
        }
        else if (this_00 == this) {
          (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
                    (this_00,1);
        }
        else {
          operator=(this_00,this);
        }
        if (this_01 == (ON_Extrusion *)0x0) {
          this_01 = (ON_Extrusion *)operator_new(0xd0);
          ON_Extrusion(this_01,this);
        }
        else if (this_01 == this) {
          (*(this_01->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
                    (this_01,1);
        }
        else {
          operator=(this_01,this);
        }
        (this_00->m_path).to.y = left_path.to.y;
        (this_00->m_path).to.z = left_path.to.z;
        (this_00->m_path).from.z = left_path.from.z;
        (this_00->m_path).to.x = left_path.to.x;
        (this_00->m_path).from.x = left_path.from.x;
        (this_00->m_path).from.y = left_path.from.y;
        (this_00->m_path_domain).m_t[0] = left_domain.m_t[0];
        (this_00->m_path_domain).m_t[1] = left_domain.m_t[1];
        (this_00->m_t).m_t[0] = left_t.m_t[0];
        (this_00->m_t).m_t[1] = left_t.m_t[1];
        (this_01->m_path).to.y = right_path.to.y;
        (this_01->m_path).to.z = right_path.to.z;
        (this_01->m_path).from.z = right_path.from.z;
        (this_01->m_path).to.x = right_path.to.x;
        (this_01->m_path).from.x = right_path.from.x;
        (this_01->m_path).from.y = right_path.from.y;
        (this_01->m_path_domain).m_t[0] = right_domain.m_t[0];
        (this_01->m_path_domain).m_t[1] = right_domain.m_t[1];
        (this_01->m_t).m_t[0] = right_t.m_t[0];
        (this_01->m_t).m_t[1] = right_t.m_t[1];
        *west_or_south_side = &this_00->super_ON_Surface;
        *east_or_north_side = &this_01->super_ON_Surface;
        bVar6 = true;
      }
    }
    ON_Line::~ON_Line(&right_path);
    ON_Line::~ON_Line(&left_path);
    return bVar6;
  }
  if (this->m_profile == (ON_Curve *)0x0) {
    return false;
  }
  left_path.from.x = 0.0;
  right_path.from.x = 0.0;
  if (this_00 == this) {
    left_path.from.x = (double)this_00->m_profile;
    (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
              (uVar7,this_00,1);
  }
  else if ((this_00 != (ON_Extrusion *)0x0) && (this_00->m_profile != (ON_Curve *)0x0)) {
    (*(this_00->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    this_00->m_profile = (ON_Curve *)0x0;
  }
  if (this_01 == this) {
    right_path.from.x = (double)this_01->m_profile;
    (*(this_01->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])
              (uVar7,this_01,1);
  }
  else if ((this_01 != (ON_Extrusion *)0x0) && (this_01->m_profile != (ON_Curve *)0x0)) {
    (*(this_01->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    this_01->m_profile = (ON_Curve *)0x0;
  }
  iVar3 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                    (uVar7,this->m_profile,&left_path,&right_path);
  if ((char)iVar3 == '\0') {
    return false;
  }
  pOVar5 = this->m_profile;
  if (right_path.from.x == 0.0 || left_path.from.x == 0.0) {
    if (pOVar5 != (ON_Curve *)left_path.from.x && left_path.from.x != 0.0) {
      (**(code **)(*(long *)left_path.from.x + 0x20))(left_path.from.x);
      pOVar5 = this->m_profile;
    }
    if (right_path.from.x == 0.0) {
      return false;
    }
    if (pOVar5 == (ON_Curve *)right_path.from.x) {
      return false;
    }
    (**(code **)(*(long *)right_path.from.x + 0x20))();
    return false;
  }
  if ((ON_Curve *)right_path.from.x != pOVar5 && (ON_Curve *)left_path.from.x != pOVar5) {
    if (this_00 != this && this_01 != this) goto LAB_003f7464;
    if (pOVar5 != (ON_Curve *)0x0) {
      (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar5);
    }
  }
  pOVar5 = (ON_Curve *)0x0;
LAB_003f7464:
  this->m_profile = (ON_Curve *)0x0;
  if (this_00 == (ON_Extrusion *)0x0) {
    this_00 = (ON_Extrusion *)operator_new(0xd0);
    ON_Extrusion(this_00,this);
  }
  else if (this_00 != this) {
    operator=(this_00,this);
  }
  if (this_01 == (ON_Extrusion *)0x0) {
    this_01 = (ON_Extrusion *)operator_new(0xd0);
    ON_Extrusion(this_01,this);
  }
  else if (this_01 != this) {
    operator=(this_01,this);
  }
  this->m_profile = pOVar5;
  this_00->m_profile = (ON_Curve *)left_path.from.x;
  this_01->m_profile = (ON_Curve *)right_path.from.x;
  *west_or_south_side = &this_00->super_ON_Surface;
  *east_or_north_side = &this_01->super_ON_Surface;
  return true;
}

Assistant:

bool ON_Extrusion::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  if ( dir < 0 || dir > 1 || !ON_IsValid(c) )
    return false;
  if ( 0 != west_or_south_side && west_or_south_side == east_or_north_side )
    return false;

  ON_Interval domain = Domain(dir);
  double s = domain.NormalizedParameterAt(c);
  if ( s <= 0.0 || s >= 1.0 )
    return false;
  if (c <= domain[0] || c >= domain[1] )
    return false;

  ON_Extrusion* left = 0;
  ON_Extrusion* right = 0;
  if ( west_or_south_side )
  {
    left = ON_Extrusion::Cast(west_or_south_side);
    if ( !left )
      return false;
  }
  if ( east_or_north_side )
  {
    right = ON_Extrusion::Cast(east_or_north_side);
    if ( !right )
      return false;
  }

  const int path_dir = PathParameter();
  bool rc = false;
  if ( dir == path_dir )
  {
    // split path
    ON_Line left_path, right_path;
    ON_Interval left_domain, right_domain;
    ON_Interval left_t, right_t;

    const double t0 = m_t[0];
    const double t1 = m_t[1];
    const double t = (1.0-s)*t0 + s*t1;
    if ( !ON_IsValid(t) || t <= t0 || t >= t1 )
      return false;

    ON_3dPoint P = m_path.PointAt(s);
    left_path.from = m_path.from;
    left_path.to = P;
    right_path.from = P;
    right_path.to = m_path.to;
    left_domain.Set(domain[0],c);
    right_domain.Set(c,domain[1]);
    left_t.Set(t0,t);
    right_t.Set(t,t1);
    if ( !left_path.IsValid() || left_path.Length() <= m_path_length_min )
      return false;
    if ( !right_path.IsValid() || right_path.Length() <= m_path_length_min )
      return false;

    // return result
    if ( !left )
      left = new ON_Extrusion(*this);
    else if ( left != this )
      left->operator =(*this);
    else
      left->DestroyRuntimeCache();
    if ( !right )
      right = new ON_Extrusion(*this);
    else if ( right != this )
      right->operator =(*this);
    else
      right->DestroyRuntimeCache();
    left->m_path = left_path;
    left->m_path_domain = left_domain;
    left->m_t = left_t;
    right->m_path = right_path;
    right->m_path_domain = right_domain;
    right->m_t = right_t;

    west_or_south_side = left;
    east_or_north_side = right;
    rc = true;
  }
  else
  {
    if ( 0 == m_profile )
      return false;
    ON_Curve* left_profile = 0;
    ON_Curve* right_profile = 0;

    if ( left == this )
    {
      left_profile = left->m_profile;
      left->DestroyRuntimeCache();
    }
    else if ( 0 != left && 0 != left->m_profile )
    {
      delete left->m_profile;
      left->m_profile = 0;
    }

    if ( right == this )
    {
      right_profile = right->m_profile;
      right->DestroyRuntimeCache();
    }
    else if ( 0 != right && 0 != right->m_profile )
    {
      delete right->m_profile;
      right->m_profile = 0;
    }

    if ( !m_profile->Split(c,left_profile,right_profile) )
      return false;
    if ( 0 == left_profile || 0 == right_profile )
    {
      if ( 0 != left_profile && m_profile != left_profile )
        delete left_profile;
      if ( 0 != right_profile && m_profile != right_profile )
        delete right_profile;
      return false;
    }

    ON_Curve* this_profile = 0;
    if ( left_profile != m_profile && right_profile != m_profile )
    {
      if ( left == this || right == this )
      {
        delete m_profile;
      }
      else
      {
        this_profile = m_profile;
      }
    }

    // Prevent this m_profile from being copied
    const_cast<ON_Extrusion*>(this)->m_profile = 0;

    // Create new left and right sides with nullptr profiles
    if ( !left )
      left = new ON_Extrusion(*this);
    else if ( left != this )
      left->operator =(*this);
    if ( !right )
      right = new ON_Extrusion(*this);
    else if ( right != this )
      right->operator =(*this);

    // Restore this m_profile
    const_cast<ON_Extrusion*>(this)->m_profile = this_profile;

    // Set left and right profiles
    left->m_profile = left_profile;
    right->m_profile = right_profile;

    west_or_south_side = left;
    east_or_north_side = right;
    rc = true;
  }

  return rc;
}